

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# table_test.cc
# Opt level: O2

void __thiscall leveldb::Harness_SimpleMulti_Test::TestBody(Harness_SimpleMulti_Test *this)

{
  int iVar1;
  Random rnd;
  allocator local_7e;
  allocator local_7d;
  Random local_7c;
  long local_78;
  string local_70;
  string local_50;
  
  for (local_78 = 0; local_78 != 0xc0; local_78 = local_78 + 0xc) {
    Harness::Init(&this->super_Harness,(TestArgs *)(kTestArgList + local_78));
    iVar1 = test::RandomSeed();
    local_7c.seed_ = iVar1 + 3U & 0x7fffffff;
    if ((local_7c.seed_ == 0x7fffffff) || (local_7c.seed_ == 0)) {
      local_7c.seed_ = 1;
    }
    std::__cxx11::string::string((string *)&local_50,"abc",&local_7d);
    std::__cxx11::string::string((string *)&local_70,"v",&local_7e);
    Harness::Add(&this->super_Harness,&local_50,&local_70);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string((string *)&local_50,"abcd",&local_7d);
    std::__cxx11::string::string((string *)&local_70,"v",&local_7e);
    Harness::Add(&this->super_Harness,&local_50,&local_70);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::string((string *)&local_50,"ac",&local_7d);
    std::__cxx11::string::string((string *)&local_70,"v2",&local_7e);
    Harness::Add(&this->super_Harness,&local_50,&local_70);
    std::__cxx11::string::_M_dispose();
    std::__cxx11::string::_M_dispose();
    Harness::Test(&this->super_Harness,&local_7c);
  }
  return;
}

Assistant:

TEST_F(Harness, SimpleMulti) {
  for (int i = 0; i < kNumTestArgs; i++) {
    Init(kTestArgList[i]);
    Random rnd(test::RandomSeed() + 3);
    Add("abc", "v");
    Add("abcd", "v");
    Add("ac", "v2");
    Test(&rnd);
  }
}